

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSpecConstantTests.cpp
# Opt level: O3

string * vkt::pipeline::anon_unknown_0::composite_case_internal::
         generateInitializerListWithSpecConstant
                   (string *__return_storage_ptr__,DataType type,bool castToType,int idxBegin,
                   int idxEnd,string *specConstName,int specConstNdx)

{
  pointer pcVar1;
  DataType DVar2;
  long *plVar3;
  string *psVar4;
  long *plVar5;
  char **value;
  char *pcVar6;
  int iVar7;
  ostringstream str;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  long *local_3a0;
  long local_398;
  long local_390;
  long lStack_388;
  long *local_380;
  long local_378;
  long local_370;
  long lStack_368;
  string *local_360;
  ulong local_358;
  string *local_350;
  char *local_348;
  string local_340;
  long *local_320;
  long local_318;
  long local_310;
  long lStack_308;
  ios_base local_2b0 [264];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_360 = __return_storage_ptr__;
  local_350 = specConstName;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  if (idxBegin < idxEnd) {
    local_358 = (ulong)(idxBegin + 1);
    iVar7 = 0;
    do {
      if (specConstNdx - idxBegin == iVar7) {
        local_3c0 = local_3b0;
        pcVar1 = (local_350->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,pcVar1,pcVar1 + local_350->_M_string_length);
      }
      else {
        DVar2 = glu::getDataTypeScalarType(type);
        if (DVar2 == TYPE_BOOL) {
          local_3c0 = local_3b0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"true","");
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_320);
          std::ostream::operator<<((ostringstream *)&local_320,(int)local_358 + iVar7);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_320);
          std::ios_base::~ios_base(local_2b0);
        }
      }
      pcVar6 = ", ";
      if (iVar7 == 0) {
        pcVar6 = "";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar6,(ulong)((uint)(iVar7 != 0) * 2));
      if (castToType) {
        local_348 = glu::getDataTypeName(type);
        de::toString<char_const*>(&local_340,(de *)&local_348,value);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_340);
        local_3a0 = &local_390;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_390 = *plVar5;
          lStack_388 = plVar3[3];
        }
        else {
          local_390 = *plVar5;
          local_3a0 = (long *)*plVar3;
        }
        local_398 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,(ulong)local_3c0);
        local_380 = &local_370;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_370 = *plVar5;
          lStack_368 = plVar3[3];
        }
        else {
          local_370 = *plVar5;
          local_380 = (long *)*plVar3;
        }
        local_378 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_380);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_310 = *plVar5;
          lStack_308 = plVar3[3];
          local_320 = &local_310;
        }
        else {
          local_310 = *plVar5;
          local_320 = (long *)*plVar3;
        }
        local_318 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
      }
      else {
        local_320 = &local_310;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_320,local_3c0,local_3b8 + (long)local_3c0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_320,local_318);
      if (local_320 != &local_310) {
        operator_delete(local_320,local_310 + 1);
      }
      if (castToType) {
        if (local_380 != &local_370) {
          operator_delete(local_380,local_370 + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_3c0 != local_3b0) {
        operator_delete(local_3c0,local_3b0[0] + 1);
      }
      iVar7 = iVar7 + 1;
    } while (idxEnd - idxBegin != iVar7);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  psVar4 = (string *)std::ios_base::~ios_base(local_138);
  return psVar4;
}

Assistant:

std::string generateInitializerListWithSpecConstant (const glu::DataType	type,
													 const bool				castToType,
													 const int				idxBegin,
													 const int				idxEnd,
													 const std::string&		specConstName,
													 const int				specConstNdx)
{
	std::ostringstream str;

	for (int i = idxBegin; i < idxEnd; ++i)
	{
		const std::string iVal = (i == specConstNdx ? specConstName : glu::getDataTypeScalarType(type) == glu::TYPE_BOOL ? "true" : de::toString(i + 1));
		str << (i != idxBegin ? ", " : "") << (castToType ? de::toString(glu::getDataTypeName(type)) + "(" + iVal + ")" : iVal);
	}

	return str.str();
}